

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O2

string * kaitai::kstream::bytes_to_str(string *__return_storage_ptr__,string *src,string *src_enc)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
  return __return_storage_ptr__;
}

Assistant:

std::string kaitai::kstream::bytes_to_str(std::string src, std::string src_enc) {
    (void)src_enc;
    return src;
}